

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::TiledInputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  pointer ppTVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  value_type *__val;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  V2f local_38;
  
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  (this->tileDesc).xSize = 0x20;
  (this->tileDesc).ySize = 0x20;
  (this->tileDesc).mode = ONE_LEVEL;
  (this->tileDesc).roundingMode = ROUND_DOWN;
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->numXTiles = (int *)0x0;
  this->numYTiles = (int *)0x0;
  TileOffsets::TileOffsets(&this->tileOffsets,ONE_LEVEL,0,0,(int *)0x0,(int *)0x0);
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->partNumber = -1;
  this->multiPartBackwardSupport = false;
  this->numThreads = numThreads;
  this->memoryMapped = false;
  this->_streamData = (InputStreamMutex *)0x0;
  this->_deleteStream = false;
  uVar8 = 1;
  if (1 < numThreads * 2) {
    uVar8 = (ulong)(uint)(numThreads * 2);
  }
  (this->tileBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->multiPartFile = (MultiPartInputFile *)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppTVar2 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar3 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)ppTVar2 - (long)ppTVar3 >> 3;
  uVar6 = uVar8 - uVar7;
  if (uVar8 < uVar7 || uVar6 == 0) {
    if ((uVar8 < uVar7) && (ppTVar3 = ppTVar3 + uVar8, ppTVar2 != ppTVar3)) {
      (this->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar3;
    }
  }
  else if ((ulong)((long)(this->tileBuffers).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2 >> 3) <
           uVar6) {
    if ((uVar7 ^ 0xfffffffffffffff) < uVar6) {
      std::__throw_length_error("vector::_M_default_append");
    }
    uVar4 = uVar6;
    if (uVar6 < uVar7) {
      uVar4 = uVar7;
    }
    uVar5 = uVar4 + uVar7;
    if (0xffffffffffffffe < uVar5) {
      uVar5 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar4,uVar7)) {
      uVar5 = 0xfffffffffffffff;
    }
    if (uVar5 == 0) {
      ppTVar3 = (pointer)0x0;
    }
    else {
      ppTVar3 = (pointer)operator_new(uVar5 * 8);
    }
    ppTVar3[uVar7] = (TileBuffer *)0x0;
    if (uVar6 != 1) {
      memset(ppTVar3 + uVar7 + 1,0,uVar6 * 8 - 8);
    }
    ppTVar2 = (this->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)(this->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
    if (0 < (long)__n) {
      memmove(ppTVar3,ppTVar2,__n);
    }
    if (ppTVar2 != (pointer)0x0) {
      operator_delete(ppTVar2,(long)(this->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppTVar2);
    }
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar3;
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar3 + uVar8;
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppTVar3 + uVar5;
  }
  else {
    *ppTVar2 = (TileBuffer *)0x0;
    ppTVar3 = ppTVar2 + 1;
    if (uVar6 != 1) {
      memset(ppTVar3,0,uVar6 * 8 - 8);
      ppTVar3 = ppTVar2 + uVar6;
    }
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar3;
  }
  return;
}

Assistant:

TiledInputFile::Data::Data (int numThreads):
    numXTiles (0),
    numYTiles (0),
    partNumber (-1),
    multiPartBackwardSupport(false),
    numThreads(numThreads),
    multiPartFile(nullptr),
    memoryMapped(false),
    _streamData(NULL),
    _deleteStream(false)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
}